

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O3

Action __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
::acceptVisitor(CoreSyntaxNodeList<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
                *this,SyntaxVisitor *visitor)

{
  GenericAssociationSyntax *this_00;
  Action AVar1;
  CoreSyntaxNodeList<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
  *it;
  
  while ((this_00 = (((SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*> *)this)->
                    super_CoreSyntaxNodeList<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
                    ).
                    super_List<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
                    .value, this_00 == (GenericAssociationSyntax *)0x0 ||
         (AVar1 = SyntaxNode::acceptVisitor(&this_00->super_SyntaxNode,visitor), AVar1 != Quit))) {
    this = &((((SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*> *)this)->
             super_CoreSyntaxNodeList<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
             ).
             super_List<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
            .next)->
            super_CoreSyntaxNodeList<psy::C::GenericAssociationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*>_>
    ;
    if ((SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*> *)this ==
        (SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax_*> *)0x0) {
      return Visit;
    }
  }
  return Quit;
}

Assistant:

virtual SyntaxVisitor::Action acceptVisitor(SyntaxVisitor* visitor) override
    {
        for (auto it = this; it; it = it->next) {
            SyntaxNodeT node = static_cast<SyntaxNodeT>(it->value);
            if (node) {
                auto action = node->acceptVisitor(visitor);
                if (action == SyntaxVisitor::Action::Quit)
                    return action;
            }
        }
        return SyntaxVisitor::Action::Visit;
    }